

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.hpp
# Opt level: O0

void __thiscall
duckdb::ListLambdaBindData::ListLambdaBindData
          (ListLambdaBindData *this,LogicalType *return_type,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *lambda_expr
          ,bool has_index,bool has_initial)

{
  byte in_CL;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *in_RDX;
  LogicalType *in_RSI;
  FunctionData *in_RDI;
  byte in_R8B;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_ffffffffffffffb8;
  
  FunctionData::FunctionData(in_RDI);
  *(undefined ***)in_RDI = &PTR__ListLambdaBindData_010a71c0;
  duckdb::LogicalType::LogicalType((LogicalType *)(in_RDI + 8),in_RSI);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            (in_RDX,in_stack_ffffffffffffffb8);
  in_RDI[0x28] = (FunctionData)(in_CL & 1);
  in_RDI[0x29] = (FunctionData)(in_R8B & 1);
  return;
}

Assistant:

ListLambdaBindData(const LogicalType &return_type, unique_ptr<Expression> lambda_expr, const bool has_index = false,
	                   const bool has_initial = false)
	    : return_type(return_type), lambda_expr(std::move(lambda_expr)), has_index(has_index),
	      has_initial(has_initial) {}